

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O2

uint64_t __thiscall ImportedFuncWrapper::getThunkValue(ImportedFuncWrapper *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar5;
  uint64_t *ptr;
  ulong *puVar4;
  
  iVar2 = (*(((this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer
            [0xb])();
  iVar3 = (*(this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])(this);
  puVar4 = (ulong *)CONCAT44(extraout_var,iVar3);
  if (puVar4 == (ulong *)0x0) {
    uVar5 = 0;
  }
  else if (iVar2 == 0x40) {
    uVar5 = *puVar4 & 0x7fffffffffffffff;
  }
  else {
    uVar1 = (uint)*puVar4;
    uVar5 = (ulong)(uVar1 & 0x7fffffff);
    if (-1 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
  }
  return uVar5;
}

Assistant:

uint64_t ImportedFuncWrapper::getThunkValue()
{
    bool is64 = (m_Exe->getBitMode() == Executable::BITS_64) ? true : false;

    uint64_t ordinal = 0;
    void* thunkPtr = getPtr();
    if (!thunkPtr) return 0;

    if (is64) {
        uint64_t* ptr =  (uint64_t*) thunkPtr;
        ordinal = *ptr;
        if (ordinal & ORDINAL_FLAG64) ordinal ^= ORDINAL_FLAG64;

    } else {
        uint32_t* ptr =  (uint32_t*) thunkPtr;
        ordinal = *ptr;
        if (uint32_t(ordinal) & ORDINAL_FLAG32) ordinal ^= ORDINAL_FLAG32;
    }

    return ordinal;
}